

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  uint *puVar1;
  SPxStatus SVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RCX;
  int in_EDX;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  norm2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  norm1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  norminv;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  norm;
  int c;
  int i;
  int miniters;
  int dimension;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff2b8;
  cpp_dec_float<100U,_int,_void> *v;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff2c0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff2c8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff2d0;
  undefined1 *puVar3;
  undefined7 in_stack_fffffffffffff2d8;
  undefined1 in_stack_fffffffffffff2df;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff2e0;
  undefined8 in_stack_fffffffffffff2e8;
  int p_dim;
  undefined4 in_stack_fffffffffffff2f0;
  type_conflict5 tVar4;
  undefined4 in_stack_fffffffffffff2f4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff318;
  undefined7 in_stack_fffffffffffff320;
  undefined1 in_stack_fffffffffffff327;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff328;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff330;
  type_conflict5 local_cc5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff390;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff398;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff3a0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff3d8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff3e0;
  undefined8 local_bd0;
  undefined1 local_bc8 [40];
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff460;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_b78;
  undefined1 local_b28 [160];
  undefined1 local_a88 [80];
  undefined1 local_a38 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9e8;
  undefined8 local_998;
  undefined1 local_990 [80];
  undefined1 local_940 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8f0;
  undefined8 local_8a0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_898;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_848;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_7f8;
  undefined8 local_538;
  cpp_dec_float<100U,_int,_void> local_530;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e0;
  cpp_dec_float<100U,_int,_void> local_490;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_440;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4 [4];
  int local_3d4;
  undefined8 local_3c0;
  undefined8 *local_3b8;
  undefined8 local_3a8;
  uint *local_3a0;
  undefined8 local_390;
  int *local_388;
  fpclass_type *local_380;
  undefined8 local_378;
  int *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  cpp_dec_float<100U,_int,_void> *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  cpp_dec_float<100U,_int,_void> *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  fpclass_type *local_338;
  cpp_dec_float<100U,_int,_void> *local_330;
  undefined1 *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  undefined1 *local_318;
  cpp_dec_float<100U,_int,_void> *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  cpp_dec_float<100U,_int,_void> *local_2f8;
  undefined1 *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d0;
  cpp_dec_float<100U,_int,_void> *local_2c8;
  fpclass_type *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  uint *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  cpp_dec_float<100U,_int,_void> *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  cpp_dec_float<100U,_int,_void> *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  cpp_dec_float<100U,_int,_void> *local_268;
  int *local_260;
  int *local_258;
  uint *local_250;
  undefined8 *local_248;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_239;
  cpp_dec_float<100U,_int,_void> *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  cpp_dec_float<100U,_int,_void> *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1a8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  cpp_dec_float<100U,_int,_void> *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  cpp_dec_float<100U,_int,_void> *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  cpp_dec_float<100U,_int,_void> *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_128;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_120;
  cpp_dec_float<100U,_int,_void> *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined8 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined8 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_68;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  fpclass_type *local_38;
  uint *local_30;
  uint *local_28;
  uint *local_20;
  fpclass_type *local_18;
  uint *local_10;
  uint *local_8;
  
  p_dim = (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20);
  local_3d4 = in_EDX;
  local_3e4[0] = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                 ::size(&in_RSI->matrix);
  local_3e8 = 3;
  local_360 = &local_440;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff2c0);
  local_358 = &local_490;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff2c0);
  local_350 = &local_4e0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff2c0);
  local_348 = &local_530;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff2c0);
  if (local_3e4[0] < 1) {
    local_538 = 0x3ff0000000000000;
    local_3b8 = &local_538;
    local_3c0 = 0;
    local_248 = local_3b8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff2d0,(double)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0
              );
  }
  else {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_RSI->theLP);
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff2c0,
               (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff2b8);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),p_dim,
                   (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff2e0);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x51c5bb);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_RSI->theLP);
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff2c0,
               (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff2b8);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),p_dim,
                   (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff2e0);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x51c61d);
    SVar2 = status(in_RSI);
    if (SVar2 < REGULAR) {
      local_7f8.minStab.m_backend.data._M_elems[5] = 0;
      local_3a0 = local_7f8.minStab.m_backend.data._M_elems + 5;
      local_3a8 = 0;
      local_250 = local_3a0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffffff2d0,(longlong)in_stack_fffffffffffff2c8,
                 in_stack_fffffffffffff2c0);
    }
    else {
      if ((in_RSI->matrixIsSetup & 1U) == 0) {
        (*in_RSI->_vptr_SPxBasisBase[5])(in_RSI,&in_RSI->thedesc);
      }
      if ((in_RSI->factorized & 1U) == 0) {
        (*in_RSI->_vptr_SPxBasisBase[0xb])();
      }
      local_7f8.lastFill.m_backend.data._M_elems[0xb] = 0;
      local_7f8.lastFill.m_backend.data._M_elems[0xc] = 0x3ff00000;
      local_380 = &local_7f8.memFactor.m_backend.fpclass;
      local_388 = local_3e4;
      local_390 = 0;
      local_258 = local_388;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffffff2d0,(longlong)in_stack_fffffffffffff2c8,
                 in_stack_fffffffffffff2c0);
      puVar1 = local_7f8.lastFill.m_backend.data._M_elems + 0xd;
      local_30 = local_7f8.lastFill.m_backend.data._M_elems + 0xb;
      local_38 = &local_7f8.memFactor.m_backend.fpclass;
      local_28 = puVar1;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_38);
      local_20 = puVar1;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff2c0);
      local_8 = local_30;
      local_18 = local_38;
      local_10 = puVar1;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (in_stack_fffffffffffff2c0,(double *)in_stack_fffffffffffff2b8,
                 (cpp_dec_float<100U,_int,_void> *)0x51c891);
      local_2a8 = &local_4e0;
      local_2b0 = local_7f8.lastFill.m_backend.data._M_elems + 0xd;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
      for (local_3ec = 0; local_3ec < local_3e4[0]; local_3ec = local_3ec + 1) {
        local_338 = &local_7f8.fillFactor.m_backend.fpclass;
        local_340 = &local_4e0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff2d0,(int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),
              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)in_stack_fffffffffffff2c0);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
      for (local_3f0 = 0; local_3f0 < local_3d4; local_3f0 = local_3f0 + 1) {
        local_268 = &local_530;
        local_270 = &local_4e0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        multBaseWith(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,in_stack_fffffffffffff390);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length(in_stack_fffffffffffff318);
        local_2b8 = &local_4e0;
        local_2c0 = &local_7f8.nonzeroFactor.m_backend.fpclass;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        local_cc5 = false;
        if (local_3e8 <= local_3f0) {
          in_stack_fffffffffffff330 = &local_7f8;
          local_130 = &local_4e0;
          local_138 = &local_530;
          local_128 = in_stack_fffffffffffff330;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_139,local_130,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_138);
          local_120 = in_stack_fffffffffffff330;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff2c0);
          local_110 = local_130;
          local_118 = local_138;
          local_108 = in_stack_fffffffffffff330;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                     (cpp_dec_float<100U,_int,_void> *)0x51cb13);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff2b8);
          in_stack_fffffffffffff328 = &local_848;
          local_1b8 = &local_4e0;
          local_1b0 = in_RCX;
          local_1a8 = in_stack_fffffffffffff328;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1b9,in_RCX,local_1b8);
          local_1a0 = in_stack_fffffffffffff328;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff2c0);
          local_190 = local_1b0;
          local_198 = local_1b8;
          local_188 = in_stack_fffffffffffff328;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                     (cpp_dec_float<100U,_int,_void> *)0x51cbe4);
          in_stack_fffffffffffff327 =
               boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffff2b8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x51cbfd);
          local_cc5 = (type_conflict5)in_stack_fffffffffffff327;
        }
        if (local_cc5 != false) break;
        multWithBase(in_stack_fffffffffffff330,in_stack_fffffffffffff328,
                     (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_fffffffffffff327,in_stack_fffffffffffff320));
        local_8a0 = 0x3ff0000000000000;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length(in_stack_fffffffffffff318);
        in_stack_fffffffffffff318 = &local_898;
        local_70 = &local_8a0;
        local_78 = &local_8f0;
        local_68 = in_stack_fffffffffffff318;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_78);
        local_60 = in_stack_fffffffffffff318;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff2c0);
        local_48 = local_70;
        local_58 = local_78;
        local_50 = in_stack_fffffffffffff318;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (in_stack_fffffffffffff2c0,(double *)in_stack_fffffffffffff2b8,
                   (cpp_dec_float<100U,_int,_void> *)0x51cd18);
        local_2d0 = &local_898;
        local_2c8 = &local_530;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        local_328 = local_940;
        local_330 = &local_530;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=(in_stack_fffffffffffff2e0,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8));
      }
      local_278 = &local_440;
      local_280 = &local_4e0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(in_stack_fffffffffffff2c8);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(in_stack_fffffffffffff2c8);
      local_998 = 0x3ff0000000000000;
      local_368 = &local_9e8;
      local_370 = local_3e4;
      local_378 = 0;
      local_260 = local_370;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffffff2d0,(longlong)in_stack_fffffffffffff2c8,
                 in_stack_fffffffffffff2c0);
      local_b0 = &local_998;
      local_b8 = &local_9e8;
      local_a8 = local_990;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_b9,local_b8);
      local_a0 = local_990;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff2c0);
      local_88 = local_b0;
      local_98 = local_b8;
      local_90 = local_990;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (in_stack_fffffffffffff2c0,(double *)in_stack_fffffffffffff2b8,
                 (cpp_dec_float<100U,_int,_void> *)0x51cf28);
      local_2d8 = &local_4e0;
      local_2e0 = local_990;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
      for (local_3ec = 0; local_3ec < local_3e4[0]; local_3ec = local_3ec + 1) {
        local_318 = local_a38;
        local_320 = &local_4e0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff2d0,(int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),
              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)in_stack_fffffffffffff2c0);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
      for (local_3f0 = 0; local_3f0 < local_3d4; local_3f0 = local_3f0 + 1) {
        local_288 = &local_530;
        local_290 = &local_4e0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        (*in_RSI->factor->_vptr_SLinSolver[0xd])
                  (in_RSI->factor,&local_7f8.freeSlinSolver,
                   local_7f8.minStab.m_backend.data._M_elems + 10);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(in_stack_fffffffffffff460);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length(in_stack_fffffffffffff318);
        local_2e8 = &local_4e0;
        local_2f0 = local_a88;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        tVar4 = false;
        if (local_3e8 <= local_3f0) {
          puVar3 = local_b28;
          local_170 = &local_4e0;
          local_178 = &local_530;
          local_168 = puVar3;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_179,local_170,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_178);
          local_160 = puVar3;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff2c0);
          local_150 = local_170;
          local_158 = local_178;
          local_148 = puVar3;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                     (cpp_dec_float<100U,_int,_void> *)0x51d1ae);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff2b8);
          in_stack_fffffffffffff2e0 = &local_b78;
          local_1f8 = &local_4e0;
          local_1f0 = in_RCX;
          local_1e8 = in_stack_fffffffffffff2e0;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1f9,in_RCX,local_1f8);
          local_1e0 = in_stack_fffffffffffff2e0;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff2c0);
          local_1d0 = local_1f0;
          local_1d8 = local_1f8;
          local_1c8 = in_stack_fffffffffffff2e0;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                     (cpp_dec_float<100U,_int,_void> *)0x51d27f);
          in_stack_fffffffffffff2df =
               boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffff2b8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x51d298);
          tVar4 = (type_conflict5)in_stack_fffffffffffff2df;
        }
        if (tVar4 != false) break;
        (*in_RSI->factor->_vptr_SLinSolver[0x15])
                  (in_RSI->factor,local_7f8.minStab.m_backend.data._M_elems + 10,
                   &local_7f8.freeSlinSolver);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(in_stack_fffffffffffff460);
        local_bd0 = 0x3ff0000000000000;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length(in_stack_fffffffffffff318);
        puVar3 = local_bc8;
        local_f0 = &local_bd0;
        local_f8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&stack0xfffffffffffff3e0;
        local_e8 = puVar3;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_f9,local_f8);
        local_e0 = puVar3;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff2c0);
        local_c8 = local_f0;
        local_d8 = local_f8;
        local_d0 = puVar3;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (in_stack_fffffffffffff2c0,(double *)in_stack_fffffffffffff2b8,
                   (cpp_dec_float<100U,_int,_void> *)0x51d3c7);
        in_stack_fffffffffffff2c0 = &local_530;
        local_300 = local_bc8;
        local_2f8 = in_stack_fffffffffffff2c0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        local_308 = &stack0xfffffffffffff390;
        local_310 = in_stack_fffffffffffff2c0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=(in_stack_fffffffffffff2e0,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8));
      }
      v = &local_490;
      local_2a0 = &local_4e0;
      local_298 = v;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_fffffffffffff2c0,v);
      local_230 = &local_440;
      local_238 = v;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_239,local_230,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)v);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff2c0);
      local_210 = local_230;
      local_218 = local_238;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (in_stack_fffffffffffff2c0,v,(cpp_dec_float<100U,_int,_void> *)0x51d554);
    }
    local_7f8.minStab.m_backend.data._M_elems[4] = 1;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_fffffffffffff2c0);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_fffffffffffff2c0);
  }
  return in_RDI;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}